

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

bool __thiscall crnlib::dxt_image::can_flip(dxt_image *this,uint axis_index)

{
  if ((uint)(this->m_format + ~cDXN_YX) < 5) {
    return false;
  }
  return *(uint *)(this->m_element_component_index + (ulong)(axis_index != 0) * 4 + -0x20) < 5 ||
         (*(uint *)(this->m_element_component_index + (ulong)(axis_index != 0) * 4 + -0x20) & 3) ==
         0;
}

Assistant:

bool dxt_image::can_flip(uint axis_index) {
  if (m_format == cETC1 || m_format == cETC2 || m_format == cETC2A || m_format == cETC1S || m_format == cETC2AS) {
    // Can't reliably flip ETCn textures (because of asymmetry in the 555/333 differential coding of subblock colors).
    return false;
  }

  uint d;
  if (axis_index)
    d = m_height;
  else
    d = m_width;

  if (d & 3) {
    if (d > 4)
      return false;
  }

  return true;
}